

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O3

wchar_t * GherkinLine_get_language(GherkinLine *line)

{
  wchar_t wchar;
  _Bool _Var1;
  wchar_t *pwVar2;
  wchar_t *string;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  
  pwVar2 = line->trimmed_line + 1;
  pwVar3 = pwVar2;
  for (; (pwVar2[-1] != L':' && (pwVar2[-1] != L'\0')); pwVar2 = pwVar2 + 1) {
    pwVar3 = pwVar3 + 1;
  }
  do {
    pwVar4 = pwVar3;
    string = pwVar2;
    pwVar5 = string;
    if (*string == L'\0') goto LAB_0011ff6f;
    _Var1 = StringUtilities_is_whitespace(*string);
    pwVar2 = string + 1;
    pwVar3 = pwVar4 + 1;
  } while (_Var1);
  wchar = *string;
  while ((wchar != L'\0' && (_Var1 = StringUtilities_is_whitespace(wchar), !_Var1))) {
    wchar = pwVar5[1];
    pwVar5 = pwVar5 + 1;
  }
LAB_0011ff6f:
  pwVar2 = StringUtilities_copy_string_part
                     (string,(wchar_t)((ulong)((long)pwVar5 - (long)pwVar4) >> 2));
  return pwVar2;
}

Assistant:

const wchar_t* GherkinLine_get_language(const GherkinLine* line) {
    const wchar_t* start = line->trimmed_line;
    while (*start != L'\0' && *start != L':')
        ++start;
    ++start;
    while (*start != L'\0' && StringUtilities_is_whitespace(*start))
        ++start;
    const wchar_t* end = start;
    while (*end != L'\0' && !StringUtilities_is_whitespace(*end))
        ++end;
    return StringUtilities_copy_string_part(start, end - start);
}